

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O1

void uv__signal_block_and_lock(sigset_t *saved_sigmask)

{
  int iVar1;
  sigset_t new_mask;
  sigset_t sStack_88;
  
  iVar1 = sigfillset(&sStack_88);
  if (iVar1 == 0) {
    sigemptyset((sigset_t *)saved_sigmask);
    iVar1 = pthread_sigmask(2,&sStack_88,(__sigset_t *)saved_sigmask);
    if (iVar1 == 0) {
      iVar1 = uv__signal_lock();
      if (iVar1 == 0) {
        return;
      }
    }
  }
  abort();
}

Assistant:

static void uv__signal_block_and_lock(sigset_t* saved_sigmask) {
  sigset_t new_mask;

  if (sigfillset(&new_mask))
    abort();

  /* to shut up valgrind */
  sigemptyset(saved_sigmask);
  if (pthread_sigmask(SIG_SETMASK, &new_mask, saved_sigmask))
    abort();

  if (uv__signal_lock())
    abort();
}